

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O2

int ImpactGenerator::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  Impact *pIVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  EffectData *pEVar5;
  ImpactInstance *random;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint n;
  uint uVar10;
  Impact *pIVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Impact imp;
  Impact local_48;
  
  pEVar5 = UnityAudioEffectState::GetEffectData<ImpactGenerator::EffectData>(state);
  memset(outbuffer,0,(long)outchannels * (ulong)length * 4);
  random = GetImpactInstance((int)pEVar5->p[0]);
  if (random == (ImpactInstance *)0x0) {
    return 0;
  }
  fVar13 = powf(10.0,pEVar5->p[1] * 0.05);
  fVar14 = powf(10.0,pEVar5->p[2] * 0.05);
  while (bVar4 = RingBuffer<1000,_ImpactGenerator::Impact>::Read(&random->impactrb,&local_48), bVar4
        ) {
    iVar9 = random->numimpacts;
    if (iVar9 < random->maximpacts) {
      random->numimpacts = iVar9 + 1;
      random->impacts[iVar9].cut = local_48.cut;
      random->impacts[iVar9].bw = local_48.bw;
      pIVar11 = random->impacts + iVar9;
      pIVar11->volume = local_48.volume;
      pIVar11->decay = local_48.decay;
      pIVar11->lpf = local_48.lpf;
      pIVar11->bpf = local_48.bpf;
    }
  }
  uVar7 = 0;
  uVar12 = 0;
  if (0 < inchannels) {
    uVar12 = (ulong)(uint)inchannels;
  }
  do {
    pIVar11 = random->impacts + uVar7;
    while( true ) {
      if (random->numimpacts <= (int)uVar7) {
        return 0;
      }
      uVar6 = 0;
      for (uVar10 = 0; uVar10 != length; uVar10 = uVar10 + 1) {
        fVar15 = Impact::Process(pIVar11,&random->random);
        iVar9 = (int)uVar6;
        uVar8 = uVar12;
        while (bVar4 = uVar8 != 0, uVar8 = uVar8 - 1, bVar4) {
          outbuffer[uVar6] = outbuffer[uVar6] + fVar15 * fVar13;
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        uVar6 = (ulong)(uint)(iVar9 + inchannels);
      }
      if (fVar14 < pIVar11->volume || fVar14 == pIVar11->volume) break;
      iVar9 = random->numimpacts;
      random->numimpacts = iVar9 + -1;
      fVar15 = random->impacts[(long)iVar9 + -1].bw;
      pIVar11->cut = random->impacts[(long)iVar9 + -1].cut;
      pIVar11->bw = fVar15;
      pIVar1 = random->impacts + (long)iVar9 + -1;
      fVar15 = pIVar1->decay;
      fVar2 = pIVar1->lpf;
      fVar3 = pIVar1->bpf;
      pIVar11->volume = pIVar1->volume;
      pIVar11->decay = fVar15;
      pIVar11->lpf = fVar2;
      pIVar11->bpf = fVar3;
    }
    uVar7 = (ulong)((int)uVar7 + 1);
  } while( true );
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        memset(outbuffer, 0, sizeof(float) * length * outchannels);

        ImpactInstance* instance = GetImpactInstance((int)data->p[P_INSTANCE]);
        if (instance == NULL)
            return UNITY_AUDIODSP_OK;

        float gain = powf(10.0f, data->p[P_GAIN] * 0.05f);
        float thr = powf(10.0f, data->p[P_THR] * 0.05f);

        Impact imp;
        while (instance->impactrb.Read(imp))
            if (instance->numimpacts < instance->maximpacts)
                instance->impacts[instance->numimpacts++] = imp;

        int i = 0;
        while (i < instance->numimpacts)
        {
            Impact& imp = instance->impacts[i];
            for (unsigned int n = 0; n < length; n++)
            {
                float impact = imp.Process(instance->random) * gain;
                for (int c = 0; c < inchannels; c++)
                    outbuffer[n * inchannels + c] += impact;
            }
            if (imp.volume < thr)
                imp = instance->impacts[--instance->numimpacts];
            else
                ++i;
        }

        return UNITY_AUDIODSP_OK;
    }